

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int items_count,float items_height)

{
  int *piVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  ImGuiWindow *pIVar6;
  ImGuiTable *table;
  ImGuiListClipperData *pIVar7;
  ImGuiContext *pIVar8;
  ImGuiListClipperData *pIVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  
  pIVar8 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  table = GImGui->CurrentTable;
  if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
    ImGui::TableEndRow(table);
  }
  this->StartPosY = (pIVar6->DC).CursorPos.y;
  this->ItemsHeight = items_height;
  this->ItemsCount = items_count;
  this->DisplayStart = -1;
  this->DisplayEnd = 0;
  iVar4 = pIVar8->ClipperTempDataStacked;
  iVar12 = (int)((long)iVar4 + 1);
  pIVar8->ClipperTempDataStacked = iVar12;
  if ((pIVar8->ClipperTempData).Size <= iVar4) {
    iVar5 = (pIVar8->ClipperTempData).Capacity;
    if (iVar5 <= iVar4) {
      if (iVar5 == 0) {
        iVar13 = 8;
      }
      else {
        iVar13 = iVar5 / 2 + iVar5;
      }
      if (iVar13 <= iVar12) {
        iVar13 = iVar12;
      }
      if (iVar5 < iVar13) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar9 = (ImGuiListClipperData *)
                 (*GImAllocatorAllocFunc)((long)iVar13 * 0x28,GImAllocatorUserData);
        pIVar7 = (pIVar8->ClipperTempData).Data;
        if (pIVar7 != (ImGuiListClipperData *)0x0) {
          memcpy(pIVar9,pIVar7,(long)(pIVar8->ClipperTempData).Size * 0x28);
          pIVar7 = (pIVar8->ClipperTempData).Data;
          if ((pIVar7 != (ImGuiListClipperData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
        }
        (pIVar8->ClipperTempData).Data = pIVar9;
        (pIVar8->ClipperTempData).Capacity = iVar13;
      }
    }
    iVar5 = (pIVar8->ClipperTempData).Size;
    if (iVar5 <= iVar4) {
      lVar10 = ((long)iVar4 + 1) - (long)iVar5;
      lVar11 = (long)iVar5 * 0x28;
      do {
        pIVar7 = (pIVar8->ClipperTempData).Data;
        *(undefined8 *)((long)&(pIVar7->Ranges).Data + lVar11) = 0;
        puVar3 = (undefined8 *)((long)&pIVar7->ItemsFrozen + lVar11);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar2 = (undefined4 *)((long)&pIVar7->ListClipper + lVar11);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2[2] = 0;
        puVar2[3] = 0;
        lVar11 = lVar11 + 0x28;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    (pIVar8->ClipperTempData).Size = iVar12;
  }
  lVar11 = (long)pIVar8->ClipperTempDataStacked;
  if ((0 < lVar11) && (pIVar8->ClipperTempDataStacked <= (pIVar8->ClipperTempData).Size)) {
    pIVar7 = (pIVar8->ClipperTempData).Data;
    pIVar9 = pIVar7 + lVar11 + -1;
    ImGuiListClipperData::Reset(pIVar9,this);
    pIVar7[lVar11 + -1].LossynessOffset = (pIVar6->DC).CursorStartPosLossyness.y;
    this->TempData = pIVar9;
    return;
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                ,0x74f,
                "T &ImVector<ImGuiListClipperData>::operator[](int) [T = ImGuiListClipperData]");
}

Assistant:

void ImGuiListClipper::Begin(int items_count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (ImGuiTable* table = g.CurrentTable)
        if (table->IsInsideRow)
            ImGui::TableEndRow(table);

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = items_count;
    DisplayStart = -1;
    DisplayEnd = 0;

    // Acquire temporary buffer
    if (++g.ClipperTempDataStacked > g.ClipperTempData.Size)
        g.ClipperTempData.resize(g.ClipperTempDataStacked, ImGuiListClipperData());
    ImGuiListClipperData* data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
    data->Reset(this);
    data->LossynessOffset = window->DC.CursorStartPosLossyness.y;
    TempData = data;
}